

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLNode::DeepClone(XMLNode *this,XMLDocument *target)

{
  int iVar1;
  undefined4 extraout_var;
  XMLNode *addThis;
  XMLNode *childClone;
  XMLNode *child;
  XMLNode *clone;
  XMLDocument *target_local;
  XMLNode *this_local;
  
  iVar1 = (*this->_vptr_XMLNode[0xc])(this,target);
  this_local = (XMLNode *)CONCAT44(extraout_var,iVar1);
  if (this_local == (XMLNode *)0x0) {
    this_local = (XMLNode *)0x0;
  }
  else {
    for (childClone = FirstChild(this); childClone != (XMLNode *)0x0;
        childClone = NextSibling(childClone)) {
      addThis = DeepClone(childClone,target);
      InsertEndChild(this_local,addThis);
    }
  }
  return this_local;
}

Assistant:

XMLNode* XMLNode::DeepClone(XMLDocument* target) const
{
	XMLNode* clone = this->ShallowClone(target);
	if (!clone) return 0;

	for (const XMLNode* child = this->FirstChild(); child; child = child->NextSibling()) {
		XMLNode* childClone = child->DeepClone(target);
		TIXMLASSERT(childClone);
		clone->InsertEndChild(childClone);
	}
	return clone;
}